

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DescriptorScalarReplacement::CreateNewDecorationForNewVariable
          (DescriptorScalarReplacement *this,Instruction *old_decoration,uint32_t new_var_id,
          uint32_t new_binding)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Op OVar1;
  IRContext *pIVar2;
  Instruction *__p;
  pointer pIVar3;
  bool bVar4;
  uint32_t local_a4;
  iterator local_a0;
  undefined8 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  uint32_t local_64;
  iterator local_60;
  undefined8 local_58;
  SmallVector<unsigned_int,_2UL> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_decoration;
  uint32_t new_binding_local;
  uint32_t new_var_id_local;
  Instruction *old_decoration_local;
  DescriptorScalarReplacement *this_local;
  
  new_decoration._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = new_binding;
  new_decoration._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = new_var_id;
  OVar1 = opt::Instruction::opcode(old_decoration);
  bVar4 = true;
  if (OVar1 != OpDecorate) {
    OVar1 = opt::Instruction::opcode(old_decoration);
    bVar4 = OVar1 == OpDecorateString;
  }
  if (bVar4) {
    pIVar2 = Pass::context(&this->super_Pass);
    __p = opt::Instruction::Clone(old_decoration,pIVar2);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_28,__p);
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&local_28);
    local_64 = new_decoration._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
    local_60 = &local_64;
    local_58 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_60;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list_00);
    opt::Instruction::SetInOperand(pIVar3,0,&local_50);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::get(&local_28);
    bVar4 = anon_unknown_16::IsDecorationBinding(pIVar3);
    if (bVar4) {
      pIVar3 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&local_28);
      local_a4 = (uint32_t)
                 new_decoration._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      local_a0 = &local_a4;
      local_98 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_a0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
      opt::Instruction::SetInOperand(pIVar3,2,&local_90);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
    }
    pIVar2 = Pass::context(&this->super_Pass);
    IRContext::AddAnnotationInst(pIVar2,&local_28);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_28);
    return;
  }
  __assert_fail("old_decoration->opcode() == spv::Op::OpDecorate || old_decoration->opcode() == spv::Op::OpDecorateString"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                ,0x109,
                "void spvtools::opt::DescriptorScalarReplacement::CreateNewDecorationForNewVariable(Instruction *, uint32_t, uint32_t)"
               );
}

Assistant:

void DescriptorScalarReplacement::CreateNewDecorationForNewVariable(
    Instruction* old_decoration, uint32_t new_var_id, uint32_t new_binding) {
  assert(old_decoration->opcode() == spv::Op::OpDecorate ||
         old_decoration->opcode() == spv::Op::OpDecorateString);
  std::unique_ptr<Instruction> new_decoration(old_decoration->Clone(context()));
  new_decoration->SetInOperand(0, {new_var_id});

  if (IsDecorationBinding(new_decoration.get())) {
    new_decoration->SetInOperand(2, {new_binding});
  }
  context()->AddAnnotationInst(std::move(new_decoration));
}